

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_base.hpp
# Opt level: O0

void __thiscall oqpi::worker_base::~worker_base(worker_base *this)

{
  worker_base *this_local;
  
  this->_vptr_worker_base = (_func_int **)&PTR__worker_base_003e5c30;
  task_handle::~task_handle(&this->hTask_);
  worker_config::~worker_config(&this->config_);
  return;
}

Assistant:

virtual ~worker_base()
        {}